

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playGround.cpp
# Opt level: O2

vector<sensor,_std::allocator<sensor>_> * __thiscall
PlayGround::execute(vector<sensor,_std::allocator<sensor>_> *__return_storage_ptr__,PlayGround *this
                   )

{
  bool bVar1;
  pair<int,_int> pVar2;
  reference this_00;
  reference pvVar3;
  reference this_01;
  sensor s;
  Room room;
  
  if ((this->action).move == true) {
    pVar2 = playableWorld::move_forward(&this->playableworld);
  }
  else {
    pVar2 = (this->playableworld).agent_location;
  }
  if ((this->action).shoot == true) {
    playableWorld::shoot(&this->playableworld);
  }
  kill_agent(this);
  this_00 = std::
            vector<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
            ::at(&(this->playableworld).world.boxes,(long)pVar2 + -0x100000000 >> 0x20);
  pvVar3 = std::vector<Room,_std::allocator<Room>_>::at(this_00,(long)(pVar2.first + -1));
  room.location = pvVar3->location;
  room.occupant = pvVar3->occupant;
  room.breeze = pvVar3->breeze;
  room.stench = pvVar3->stench;
  room.glitter = pvVar3->glitter;
  room._15_1_ = pvVar3->field_0xf;
  (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Room::get_breeze(&room);
  if (bVar1) {
    sensor::sensor(&s,pVar2,B);
    std::vector<sensor,_std::allocator<sensor>_>::push_back(__return_storage_ptr__,&s);
    (this->p).breeze = true;
  }
  bVar1 = Room::get_stench(&room);
  if (bVar1) {
    sensor::sensor(&s,pVar2,S);
    std::vector<sensor,_std::allocator<sensor>_>::push_back(__return_storage_ptr__,&s);
    (this->p).stench = true;
  }
  bVar1 = Room::get_glitter(&room);
  if (bVar1) {
    sensor::sensor(&s,pVar2,G);
    std::vector<sensor,_std::allocator<sensor>_>::push_back(__return_storage_ptr__,&s);
    this->is_gold_found = true;
    (this->p).glitter = true;
  }
  bVar1 = Room::has_pit(&room);
  if (bVar1) {
    sensor::sensor(&s,pVar2,P);
    std::vector<sensor,_std::allocator<sensor>_>::push_back(__return_storage_ptr__,&s);
  }
  bVar1 = Room::has_wumpus(&room);
  if (bVar1) {
    sensor::sensor(&s,pVar2,W);
    std::vector<sensor,_std::allocator<sensor>_>::push_back(__return_storage_ptr__,&s);
    (this->p).wumpus = true;
  }
  if (this->is_wumpus_dead == true) {
    this_01 = std::vector<sensor,_std::allocator<sensor>_>::at(__return_storage_ptr__,0);
    pVar2 = sensor::get_Location(this_01);
    sensor::sensor(&s,pVar2,scream);
    (this->p).scream = true;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<sensor> PlayGround::execute()
{
    pair<int, int> location = playableworld.agent_location;
    if (action.move)
    {
        location = playableworld.move_forward();
    }
    if (action.shoot)
    {
        playableworld.shoot();
    }
    kill_agent();

    Room room = playableworld.world.boxes.at(location.second - 1).at(location.first - 1);
    vector<sensor> perception;
    if (room.get_breeze())
    {
        Type type = Type::B;
        sensor s = sensor(location, type);
        perception.push_back(s);
        p.breeze=true;
    }
    if (room.get_stench())
    {
        Type type = Type::S;
        sensor s = sensor(location, type);
        perception.push_back(s);
        p.stench=true;
    }
    if (room.get_glitter())
    {
        Type type = Type::G;
        sensor s = sensor(location, type);
        perception.push_back(s);
        is_gold_found = true;
        p.glitter=true;
    }
    if (room.has_pit())
    {
        Type type = Type::P;
        sensor s = sensor(location, type);
        perception.push_back(s);

    }
    if (room.has_wumpus())
    {
        Type type = Type::W;
        sensor s = sensor(location, type);
        perception.push_back(s);
        p.wumpus=true;
    }
    if (is_wumpus_dead)
    {
        Type t = Type::scream;
        sensor s = sensor(perception.at(0).get_Location(), t);
        p.scream=true;
    }
    return perception;
}